

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipAnalysis.cpp
# Opt level: O2

void __thiscall HighsMipAnalysis::setupMipTime(HighsMipAnalysis *this,HighsOptions *options)

{
  uint uVar1;
  MipTimer mip_timer;
  HighsTimerClock clock;
  MipTimer local_31;
  HighsTimerClock local_30;
  
  uVar1 = (options->super_HighsOptionsStruct).highs_analysis_level & 0x80;
  this->analyse_mip_time = SUB41(uVar1 >> 7,0);
  if (uVar1 != 0) {
    local_30.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_30.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_30.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_30.timer_pointer_ = this->timer_;
    MipTimer::initialiseMipClocks(&local_31,&local_30);
    HighsTimerClock::operator=(&this->mip_clocks,&local_30);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_30.clock_.super__Vector_base<int,_std::allocator<int>_>);
  }
  return;
}

Assistant:

void HighsMipAnalysis::setupMipTime(const HighsOptions& options) {
  analyse_mip_time = kHighsAnalysisLevelMipTime & options.highs_analysis_level;
  if (analyse_mip_time) {
    HighsTimerClock clock;
    clock.timer_pointer_ = timer_;
    MipTimer mip_timer;
    mip_timer.initialiseMipClocks(clock);
    mip_clocks = clock;
  }
}